

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O2

uint32 __thiscall Js::WebAssemblyModule::GetModuleEnvironmentSize(WebAssemblyModule *this)

{
  uint32 uVar1;
  uint offset;
  uint32 rhs;
  
  uVar1 = UInt32Math::Add(3,(((this->m_functionsInfo).ptr)->
                            super_ReadOnlyList<Wasm::WasmFunctionInfo_*,_Memory::Recycler,_DefaultComparer>
                            ).count);
  uVar1 = UInt32Math::Add(uVar1,this->m_importedFunctionCount);
  offset = GetGlobalsByteSize(this);
  rhs = WAsmJs::ConvertOffset<unsigned_char,void*>(offset);
  uVar1 = UInt32Math::Add(uVar1,rhs);
  return uVar1;
}

Assistant:

uint32
WebAssemblyModule::GetModuleEnvironmentSize() const
{
    static const uint DOUBLE_SIZE_IN_INTS = sizeof(double) / sizeof(int);
    // 1 each for memory, table, and signatures
    uint32 size = 3;
    size = UInt32Math::Add(size, GetWasmFunctionCount());
    size = UInt32Math::Add(size, GetImportedFunctionCount());
    size = UInt32Math::Add(size, WAsmJs::ConvertOffset<byte, Js::Var>(GetGlobalsByteSize()));
    return size;
}